

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int StartCDAudioPlaying(SDL12_CD *cdrom,int start_track,int start_frame,int ntracks,int nframes)

{
  SDL12_CDstatus SVar1;
  AudioCallbackWrapperData *pAVar2;
  SDL_bool SVar3;
  drmp3 *mp3;
  int iVar4;
  ulong uVar5;
  
  mp3 = (drmp3 *)(*SDL20_malloc)(0x3ec0);
  if (mp3 == (drmp3 *)0x0) {
    iVar4 = (*SDL20_Error)(SDL_ENOMEM);
    return iVar4;
  }
  SVar3 = LoadCDTrack(start_track,mp3);
  iVar4 = 0;
  if (0 < start_frame && SVar3 != SDL_FALSE) {
    uVar5 = (ulong)((double)(int)mp3->sampleRate * ((double)start_frame / 75.0));
    iVar4 = (int)uVar5;
    drmp3_seek_to_pcm_frame(mp3,uVar5 & 0xffffffff);
  }
  (*SDL20_LockAudio)();
  pAVar2 = audio_cbdata;
  if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
    SVar1 = (uint)(SVar3 != SDL_FALSE) * 2;
    audio_cbdata->cdrom_status = SVar1;
    cdrom->status = SVar1;
    pAVar2->cdrom_pcm_frames_written = iVar4;
    pAVar2->cdrom_cur_track = start_track;
    pAVar2->cdrom_cur_frame = start_frame;
    pAVar2->cdrom_stop_ntracks = ntracks;
    pAVar2->cdrom_stop_nframes = nframes;
    FreeMp3(&pAVar2->cdrom_mp3);
    if (SVar3 == SDL_FALSE) {
      (*SDL20_UnlockAudio)();
      (*SDL20_free)(mp3);
      goto LAB_0011287f;
    }
    (*SDL20_memcpy)(&audio_cbdata->cdrom_mp3,mp3,0x3ec0);
  }
  (*SDL20_UnlockAudio)();
  (*SDL20_free)(mp3);
  if (SVar3 != SDL_FALSE) {
    return 0;
  }
LAB_0011287f:
  iVar4 = (*SDL20_SetError)("Failed to start CD track");
  return iVar4;
}

Assistant:

static int
StartCDAudioPlaying(SDL12_CD *cdrom, const int start_track, const int start_frame, const int ntracks, const int nframes)
{
    drmp3 *mp3 = (drmp3 *) SDL20_malloc(sizeof (drmp3));
    const SDL_bool loaded = mp3 ? LoadCDTrack(start_track, mp3) : SDL_FALSE;
    const SDL_bool seeking = (loaded && (start_frame > 0))? SDL_TRUE : SDL_FALSE;
    const drmp3_uint32 pcm_frame = seeking ? (Uint32) ((start_frame / 75.0) * (Sint32)mp3->sampleRate) : 0;

    if (!mp3) {
        return SDL20_OutOfMemory();
    }

    if (seeking) {   /* do seeking before handing off to the audio thread. */
        drmp3_seek_to_pcm_frame(mp3, pcm_frame);
    }

    SDL20_LockAudio();
    if (audio_cbdata) {
        cdrom->status = audio_cbdata->cdrom_status = loaded ? SDL12_CD_PLAYING : SDL12_CD_TRAYEMPTY;
        audio_cbdata->cdrom_pcm_frames_written = (int) pcm_frame;
        audio_cbdata->cdrom_cur_track = start_track;
        audio_cbdata->cdrom_cur_frame = start_frame;
        audio_cbdata->cdrom_stop_ntracks = ntracks;
        audio_cbdata->cdrom_stop_nframes = nframes;
        FreeMp3(&audio_cbdata->cdrom_mp3);
        if (loaded) {
            SDL20_memcpy(&audio_cbdata->cdrom_mp3, mp3, sizeof (drmp3));
        }
    }
    SDL20_UnlockAudio();

    SDL20_free(mp3);

    return loaded ? 0 : SDL20_SetError("Failed to start CD track");
}